

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

OneStepDelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OneStepDelaySyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  OneStepDelaySyntax *pOVar11;
  
  pOVar11 = (OneStepDelaySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OneStepDelaySyntax *)this->endPtr < pOVar11 + 1) {
    pOVar11 = (OneStepDelaySyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pOVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pOVar11->super_TimingControlSyntax).super_SyntaxNode.kind = OneStepDelay;
  (pOVar11->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pOVar11->super_TimingControlSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pOVar11->hash).kind = TVar3;
  (pOVar11->hash).field_0x2 = uVar4;
  (pOVar11->hash).numFlags = (NumericTokenFlags)NVar5.raw;
  (pOVar11->hash).rawLen = uVar6;
  (pOVar11->hash).info = pIVar1;
  (pOVar11->oneStep).kind = TVar7;
  (pOVar11->oneStep).field_0x2 = uVar8;
  (pOVar11->oneStep).numFlags = (NumericTokenFlags)NVar9.raw;
  (pOVar11->oneStep).rawLen = uVar10;
  (pOVar11->oneStep).info = pIVar2;
  return pOVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }